

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbAddrModeRR(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  DecodeStatus DVar3;
  MCInst *in_RCX;
  uint32_t in_ESI;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc8;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  fieldFromInstruction_4(in_ESI,0,3);
  uVar2 = fieldFromInstruction_4(in_ESI,3,3);
  DVar3 = DecodetGPRRegisterClass
                    (in_RCX,local_4,CONCAT44(uVar2,in_stack_ffffffffffffffc8),(void *)0x2a2baf);
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar3);
  if (_Var1) {
    DVar3 = DecodetGPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar2,in_stack_ffffffffffffffc8),(void *)0x2a2be1);
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar3);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeThumbAddrModeRR(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 0, 3);
	unsigned Rm = fieldFromInstruction_4(Val, 3, 3);

	if (!Check(&S, DecodetGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodetGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}